

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_wif_trace.cpp
# Opt level: O2

ssize_t __thiscall
sc_core::wif_sc_bit_trace::write(wif_sc_bit_trace *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  sc_bit *psVar2;
  undefined4 in_register_00000034;
  char *__format;
  
  psVar2 = this->object;
  sc_dt::sc_deprecated_sc_bit();
  __format = "assign %s \'1\' ;\n";
  if (psVar2->m_val == false) {
    __format = "assign %s \'0\' ;\n";
  }
  fprintf((FILE *)CONCAT44(in_register_00000034,__fd),__format,
          (this->super_wif_trace).wif_name._M_dataplus._M_p);
  psVar2 = this->object;
  bVar1 = psVar2->m_val;
  (this->old_value).m_val = bVar1;
  return CONCAT71((int7)((ulong)psVar2 >> 8),bVar1);
}

Assistant:

void wif_sc_bit_trace::write(FILE* f)
{
    if (object == true) {
        std::fprintf(f, "assign %s \'1\' ;\n", wif_name.c_str());
    } else {
	std::fprintf(f, "assign %s \'0\' ;\n", wif_name.c_str());
    }
    old_value = object;
}